

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libntlmconnect.c
# Opt level: O1

int test(char *url)

{
  int iVar1;
  int extraout_EAX;
  uint uVar2;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  int extraout_EAX_09;
  int extraout_EAX_10;
  int extraout_EAX_11;
  int extraout_EAX_12;
  int extraout_EAX_13;
  int extraout_EAX_14;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  CURL *pCVar7;
  ulong uVar8;
  ulong extraout_RAX;
  CURL *extraout_RAX_00;
  long extraout_RAX_01;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  char cVar15;
  bool bVar16;
  timeval tVar17;
  curl_socket_t maxfd;
  int running;
  long timeout;
  timeval interval;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  int local_20c;
  ulong local_208;
  int local_1fc;
  long local_1f8;
  ulong local_1f0;
  uint local_1e4;
  char *local_1e0;
  char *local_1d8;
  timeval local_1d0;
  long local_1c0;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  sVar3 = strlen(url);
  pcVar4 = (char *)malloc(sVar3 + 5);
  tv_test_start = tutil_tvnow();
  if (pcVar4 == (char *)0x0) {
    test_cold_23();
    iVar1 = 0x1b;
  }
  else {
    easy[0] = (CURL *)0x0;
    easy[1] = (CURL *)0x0;
    easy[2] = (CURL *)0x0;
    sockets[0] = -1;
    sockets[1] = -1;
    sockets[2] = -1;
    res = 0;
    iVar1 = curl_global_init(3);
    if (iVar1 != 0) {
      test_cold_1();
    }
    iVar1 = res;
    if (res == 0) {
      lVar5 = curl_multi_init();
      if (lVar5 == 0) {
        test_cold_2();
      }
      if (res == 0) {
        cVar15 = '\0';
        local_208 = 0;
        local_1d8 = url;
        do {
          local_1f8 = -99;
          local_20c = -1;
          if (cVar15 == '\0') {
            pCVar7 = (CURL *)curl_easy_init();
            iVar14 = (int)local_208;
            lVar6 = (long)(int)local_208;
            easy[lVar6] = pCVar7;
            if (pCVar7 == (CURL *)0x0) {
              test_cold_3();
              pCVar7 = extraout_RAX_00;
            }
            iVar1 = (int)pCVar7;
            cVar15 = '\0';
            iVar13 = 0xd;
            if (res == 0) {
              if (iVar14 % 3 == 2) {
                sprintf(pcVar4,"%s0200",local_1d8);
                iVar1 = curl_easy_setopt(easy[lVar6],0x6b,8);
                if (iVar1 != 0) {
                  test_cold_5();
                  iVar1 = extraout_EAX;
                }
              }
              else {
                sprintf(pcVar4,"%s0100",local_1d8);
                iVar1 = curl_easy_setopt(easy[lVar6],0x6b,1);
                if (iVar1 != 0) {
                  test_cold_4();
                  iVar1 = extraout_EAX_01;
                }
              }
              if (res == 0) {
                iVar1 = curl_easy_setopt(easy[lVar6],0x4a,1);
                if (iVar1 != 0) {
                  test_cold_6();
                  iVar1 = extraout_EAX_02;
                }
                if (res == 0) {
                  iVar1 = curl_easy_setopt(easy[lVar6],0x2712,pcVar4);
                  if (iVar1 != 0) {
                    test_cold_7();
                    iVar1 = extraout_EAX_04;
                  }
                  if (res == 0) {
                    iVar1 = curl_easy_setopt(easy[lVar6],0x29,1);
                    if (iVar1 != 0) {
                      test_cold_8();
                      iVar1 = extraout_EAX_06;
                    }
                    if (res == 0) {
                      iVar1 = curl_easy_setopt(easy[lVar6],0x50,1);
                      if (iVar1 != 0) {
                        test_cold_9();
                        iVar1 = extraout_EAX_08;
                      }
                      if (res == 0) {
                        iVar1 = curl_easy_setopt(easy[lVar6],0x2715,"testuser:testpass");
                        if (iVar1 != 0) {
                          test_cold_10();
                          iVar1 = extraout_EAX_09;
                        }
                        if (res == 0) {
                          iVar1 = curl_easy_setopt(easy[lVar6],0x4e2b,callback);
                          if (iVar1 != 0) {
                            test_cold_11();
                            iVar1 = extraout_EAX_11;
                          }
                          if (res == 0) {
                            iVar1 = curl_easy_setopt(easy[lVar6],0x2711);
                            if (iVar1 != 0) {
                              test_cold_12();
                              iVar1 = extraout_EAX_12;
                            }
                            if (res == 0) {
                              iVar1 = curl_easy_setopt(easy[lVar6],0x2a,1);
                              if (iVar1 != 0) {
                                test_cold_13();
                                iVar1 = extraout_EAX_13;
                              }
                              if (res == 0) {
                                iVar1 = curl_multi_add_handle(lVar5,easy[lVar6]);
                                if (iVar1 != 0) {
                                  test_cold_14();
                                  iVar1 = extraout_EAX_14;
                                }
                                if (res == 0) {
                                  local_208 = (ulong)((int)local_208 + 1);
                                  cVar15 = '\x01';
                                  goto LAB_00102a0d;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
LAB_00102a0d:
            iVar1 = curl_multi_perform(lVar5,&local_1fc);
            if (iVar1 == 0) {
              iVar1 = 0;
              if (local_1fc < 0) {
                iVar1 = fprintf(_stderr,
                                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                                ,0x96);
                res = 0x7a;
              }
            }
            else {
              test_cold_15();
              res = iVar1;
              iVar1 = extraout_EAX_00;
            }
            if (res == 0) {
              tVar17 = tutil_tvnow();
              lVar6 = tutil_tvdiff(tVar17,tv_test_start);
              if (5000 < lVar6) {
                test_cold_16();
                lVar6 = extraout_RAX_01;
              }
              iVar1 = (int)lVar6;
              if (res == 0) {
                if ((cVar15 == '\x02') && (local_1fc == 0)) {
                  cVar15 = '\x02';
                  iVar13 = 0xe;
                  goto LAB_0010304d;
                }
                local_1b8.__fds_bits[0xe] = 0;
                local_1b8.__fds_bits[0xf] = 0;
                local_1b8.__fds_bits[0xc] = 0;
                local_1b8.__fds_bits[0xd] = 0;
                local_1b8.__fds_bits[10] = 0;
                local_1b8.__fds_bits[0xb] = 0;
                local_1b8.__fds_bits[8] = 0;
                local_1b8.__fds_bits[9] = 0;
                local_1b8.__fds_bits[6] = 0;
                local_1b8.__fds_bits[7] = 0;
                local_1b8.__fds_bits[4] = 0;
                local_1b8.__fds_bits[5] = 0;
                local_1b8.__fds_bits[2] = 0;
                local_1b8.__fds_bits[3] = 0;
                local_1b8.__fds_bits[0] = 0;
                local_1b8.__fds_bits[1] = 0;
                local_b8.__fds_bits[0] = 0;
                local_b8.__fds_bits[1] = 0;
                local_b8.__fds_bits[2] = 0;
                local_b8.__fds_bits[3] = 0;
                local_b8.__fds_bits[4] = 0;
                local_b8.__fds_bits[5] = 0;
                local_b8.__fds_bits[6] = 0;
                local_b8.__fds_bits[7] = 0;
                local_b8.__fds_bits[8] = 0;
                local_b8.__fds_bits[9] = 0;
                local_b8.__fds_bits[10] = 0;
                local_b8.__fds_bits[0xb] = 0;
                local_b8.__fds_bits[0xc] = 0;
                local_b8.__fds_bits[0xd] = 0;
                local_b8.__fds_bits[0xe] = 0;
                local_b8.__fds_bits[0xf] = 0;
                local_138.__fds_bits[0] = 0;
                local_138.__fds_bits[1] = 0;
                local_138.__fds_bits[2] = 0;
                local_138.__fds_bits[3] = 0;
                local_138.__fds_bits[4] = 0;
                local_138.__fds_bits[5] = 0;
                local_138.__fds_bits[6] = 0;
                local_138.__fds_bits[7] = 0;
                local_138.__fds_bits[8] = 0;
                local_138.__fds_bits[9] = 0;
                local_138.__fds_bits[10] = 0;
                local_138.__fds_bits[0xb] = 0;
                local_138.__fds_bits[0xc] = 0;
                local_138.__fds_bits[0xd] = 0;
                local_138.__fds_bits[0xe] = 0;
                local_138.__fds_bits[0xf] = 0;
                iVar1 = curl_multi_fdset(lVar5,&local_1b8,&local_b8,&local_138,&local_20c);
                if (iVar1 == 0) {
                  iVar1 = 0;
                  if (local_20c < -1) {
                    iVar1 = fprintf(_stderr,
                                    "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                                    ,0xa3);
                    res = 0x7a;
                  }
                }
                else {
                  test_cold_17();
                  res = iVar1;
                  iVar1 = extraout_EAX_03;
                }
                if (res == 0) {
                  uVar11 = 0;
                  if (-1 < local_20c) {
                    local_1e4 = (int)local_208 - 1;
                    lVar6 = (long)(int)local_1e4;
                    uVar9 = local_208 & 0xffffffff;
                    uVar12 = 0;
                    local_1e0 = pcVar4;
                    do {
                      uVar10 = (uint)uVar11;
                      uVar8 = local_1b8.__fds_bits[uVar11 >> 6];
                      iVar13 = 0x5d;
                      if ((uVar8 >> (uVar11 & 0x3f) & 1) != 0) {
                        if (0 < (int)local_208) {
                          uVar8 = 0;
                          do {
                            if (*(uint *)((long)sockets + uVar8) == uVar10) goto LAB_00102e6c;
                            uVar8 = uVar8 + 4;
                          } while (uVar9 << 2 != uVar8);
                        }
                        if ((cVar15 == '\x01') && ((uVar12 & 1) == 0)) {
                          uVar2 = sockets[lVar6];
                          if (uVar2 == 0xffffffff) {
                            sockets[lVar6] = uVar10;
                            iVar13 = 0;
                            uVar12 = CONCAT71((int7)(uVar12 >> 8),1);
                          }
                          else {
                            local_1c0 = lVar6;
                            if (uVar10 == uVar2) {
                              local_1f0 = uVar12;
                              __assert_fail("curfd != sockets[num_handles-1]",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                                            ,0xc4,"int test(char *)");
                            }
                            local_1f0 = uVar12;
                            uVar2 = fprintf(_stderr,
                                            "Handle %d wrote to socket %d then detected on %d\n",
                                            (ulong)local_1e4,(ulong)uVar2,uVar11);
                            uVar8 = (ulong)uVar2;
                            res = 0x7e;
                            iVar13 = 0xd;
                            lVar6 = local_1c0;
                            uVar12 = local_1f0;
                          }
                        }
                        else {
                          local_1f0 = uVar12;
                          test_cold_18();
                          iVar13 = 0xd;
                          uVar8 = extraout_RAX;
                          uVar12 = local_1f0;
                        }
                      }
LAB_00102e6c:
                      iVar1 = (int)uVar8;
                      pcVar4 = local_1e0;
                      if ((iVar13 != 0x5d) && (iVar13 != 0)) goto LAB_0010304d;
                      uVar11 = (ulong)(uVar10 + 1);
                    } while ((int)uVar10 < local_20c);
                    uVar11 = uVar12 & 0xffffffff;
                  }
                  uVar12 = local_208;
                  bVar16 = cVar15 == '\x01';
                  cVar15 = '\x02';
                  iVar14 = (int)local_208;
                  if (bVar16) {
                    if (local_20c != -1 && (uVar11 & 1) == 0) {
                      test_cold_19();
                      cVar15 = '\x01';
                      iVar13 = 0xf;
                      iVar1 = extraout_EAX_07;
                      goto LAB_0010304d;
                    }
                    cVar15 = (2 < iVar14) * '\x02';
                  }
                  iVar1 = curl_multi_timeout(lVar5,&local_1f8);
                  if (iVar1 == 0) {
                    iVar1 = 0;
                    if (local_1f8 < -1) {
                      iVar1 = fprintf(_stderr,
                                      "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                                      ,0xdb);
                      res = 0x73;
                    }
                  }
                  else {
                    test_cold_20();
                    res = iVar1;
                    iVar1 = extraout_EAX_05;
                  }
                  if (res == 0) {
                    fprintf(_stderr,"%s:%d num_handles %d timeout %ld\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xe0,uVar12 & 0xffffffff,local_1f8);
                    if (local_1f8 == -1) {
                      local_1d0.tv_sec = 6;
                      local_1d0.tv_usec = 0;
                      if (iVar14 == 3 && local_1fc == 0) {
                        iVar1 = 3;
                        local_208 = 3;
                        iVar13 = 0xe;
                        goto LAB_0010304d;
                      }
                    }
                    else {
                      local_1d0.tv_sec = local_1f8 / 1000;
                      local_1d0.tv_usec = (local_1f8 % 1000) * 1000;
                    }
                    iVar1 = select_wrapper(local_20c + 1,&local_1b8,&local_b8,&local_138,&local_1d0)
                    ;
                    if (iVar1 == -1) {
                      test_cold_21();
                      iVar1 = extraout_EAX_10;
                    }
                    if (res == 0) {
                      tVar17 = tutil_tvnow();
                      lVar6 = tutil_tvdiff(tVar17,tv_test_start);
                      if (5000 < lVar6) {
                        test_cold_22();
                      }
                      iVar1 = 0xd;
                      iVar13 = res;
                      if (res != 0) {
                        iVar13 = 0xd;
                      }
                      goto LAB_0010304d;
                    }
                  }
                }
              }
            }
            iVar13 = 0xd;
          }
LAB_0010304d:
        } while ((iVar13 == 0) || (iVar13 == 0xf));
        if (1 < iVar13 - 0xdU) goto LAB_00103276;
      }
      lVar6 = 0;
      do {
        if (*(long *)((long)easy + lVar6) != 0) {
          if (lVar5 != 0) {
            curl_multi_remove_handle(lVar5);
          }
          curl_easy_cleanup(*(undefined8 *)((long)easy + lVar6));
        }
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x18);
      if (lVar5 != 0) {
        curl_multi_cleanup(lVar5);
      }
      curl_global_cleanup();
      free(pcVar4);
      iVar1 = res;
    }
  }
LAB_00103276:
  return iVar1;
}

Assistant:

int test(char *url)
{
  CURLM *multi = NULL;
  int running;
  int i, j;
  int num_handles = 0;
  enum HandleState state = ReadyForNewHandle;
  char* full_url = malloc(strlen(url) + 4 + 1);

  start_test_timing();

  if (!full_url) {
    fprintf(stderr, "Not enough memory for full url\n");
    return CURLE_OUT_OF_MEMORY;
  }

  for (i = 0; i < MAX_EASY_HANDLES; ++i) {
    easy[i] = NULL;
    sockets[i] = -1;
  }

  res = 0;
  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    return res;
  }

  multi_init(multi);

  for(;;) {
    struct timeval interval;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    long timeout = -99;
    curl_socket_t curfd, maxfd = INVALID_SOCKET;
    bool found_new_socket = FALSE;

    /* Start a new handle if we aren't at the max */
    if (state == ReadyForNewHandle) {
      easy_init(easy[num_handles]);

      if (num_handles % 3 == 2) {
        sprintf(full_url, "%s0200", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_NTLM);
      } else {
        sprintf(full_url, "%s0100", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
      }
      easy_setopt(easy[num_handles], CURLOPT_FRESH_CONNECT, 1L);
      easy_setopt(easy[num_handles], CURLOPT_URL, full_url);
      easy_setopt(easy[num_handles], CURLOPT_VERBOSE, 1L);
      easy_setopt(easy[num_handles], CURLOPT_HTTPGET, 1L);
      easy_setopt(easy[num_handles], CURLOPT_USERPWD, "testuser:testpass");
      easy_setopt(easy[num_handles], CURLOPT_WRITEFUNCTION, callback);
      easy_setopt(easy[num_handles], CURLOPT_WRITEDATA, easy + num_handles);
      easy_setopt(easy[num_handles], CURLOPT_HEADER, 1L);

      multi_add_handle(multi, easy[num_handles]);
      num_handles += 1;
      state = NeedSocketForNewHandle;
    }

    multi_perform(multi, &running);
    if (0 != res)
      break;

    abort_on_test_timeout();

    if(!running && state == NoMoreHandles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, (int *)&maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    /* Any socket which is new in fdread is associated with the new handle */
    for (curfd = 0; curfd <= maxfd; ++curfd) {
      bool socket_exists = FALSE;
      if (!FD_ISSET(curfd, &fdread)) {
        continue;
      }

      /* Check if this socket was already detected for an earlier handle (or
         for this handle, num_handles-1, in the callback */
      for (j = 0; j < num_handles; ++j) {
        if (sockets[j] == curfd) {
          socket_exists = TRUE;
          break;
        }
      }
      if (socket_exists) {
        continue;
      }

      if (found_new_socket || state != NeedSocketForNewHandle) {
        fprintf(stderr, "Unexpected new socket\n");
        res = TEST_ERR_MAJOR_BAD;
        goto test_cleanup;
      }

      /* Now we know the socket is for the most recent handle, num_handles-1 */
      if (sockets[num_handles-1] != INVALID_SOCKET) {
        /* A socket for this handle was already detected in the callback; if it
           matched socket_exists should be true and we would never get here */
        assert(curfd != sockets[num_handles-1]);
        fprintf(stderr, "Handle %d wrote to socket %d then detected on %d\n",
                num_handles-1, sockets[num_handles-1], curfd);
        res = TEST_ERR_MAJOR_BAD;
        goto test_cleanup;
      }
      else {
        sockets[num_handles-1] = curfd;
        found_new_socket = TRUE;
        /* continue to make sure there's only one new handle */
      }
    }

    if (state == NeedSocketForNewHandle) {
      if(maxfd != -1 && !found_new_socket) {
        fprintf(stderr, "Warning: socket did not open immediately for new "
                "handle (trying again)\n");
        continue;
      }
      state = num_handles < MAX_EASY_HANDLES ? ReadyForNewHandle
                                             : NoMoreHandles;
    }

    multi_timeout(multi, &timeout);

    /* At this point, timeout is guaranteed to be greater or equal than -1. */

    fprintf(stderr, "%s:%d num_handles %d timeout %ld\n",
            __FILE__, __LINE__, num_handles, timeout);

    if(timeout != -1L) {
      interval.tv_sec = timeout/1000;
      interval.tv_usec = (timeout%1000)*1000;
    }
    else {
      interval.tv_sec = TEST_HANG_TIMEOUT/1000+1;
      interval.tv_usec = 0;

      /* if there's no timeout and we get here on the last handle, we may
         already have read the last part of the stream so waiting makes no
         sense */
      if(!running && num_handles == MAX_EASY_HANDLES) {
        break;
      }
    }

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  for (i = 0; i < MAX_EASY_HANDLES; ++i) {
    if (easy[i]) {
       if (multi) {
         curl_multi_remove_handle(multi, easy[i]);
       }
       curl_easy_cleanup(easy[i]);
    }
  }

  if (multi) {
    curl_multi_cleanup(multi);
  }

  curl_global_cleanup();

  if (full_url) {
    free(full_url);
  }

  return res;
}